

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O0

void rw::instV4d(int type,uint8 *dst,V4d *src,uint32 numVertices,uint32 stride)

{
  float32 fVar1;
  uint local_2c;
  uint32 i;
  uint32 stride_local;
  uint32 numVertices_local;
  V4d *src_local;
  uint8 *dst_local;
  int type_local;
  
  if (type == 9) {
    _stride_local = src;
    src_local = (V4d *)dst;
    for (local_2c = 0; local_2c < numVertices; local_2c = local_2c + 1) {
      fVar1 = _stride_local->y;
      src_local->x = _stride_local->x;
      src_local->y = fVar1;
      fVar1 = _stride_local->w;
      src_local->z = _stride_local->z;
      src_local->w = fVar1;
      src_local = (V4d *)((long)&src_local->x + (ulong)stride);
      _stride_local = _stride_local + 1;
    }
  }
  return;
}

Assistant:

void
instV4d(int type, uint8 *dst, V4d *src, uint32 numVertices, uint32 stride)
{
	if(type == VERT_FLOAT4)
		for(uint32 i = 0; i < numVertices; i++){
			memcpy(dst, src, 16);
			dst += stride;
			src++;
		}
	else
		assert(0 && "unsupported instV4d type");
}